

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::TrackEventCategory::operator==
          (TrackEventCategory *this,TrackEventCategory *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  if (_Var1) {
    _Var1 = ::std::operator==(&this->name_,&other->name_);
    if (_Var1) {
      _Var1 = ::std::operator==(&this->description_,&other->description_);
      if (_Var1) {
        bVar2 = ::std::operator==(&this->tags_,&other->tags_);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool TrackEventCategory::operator==(const TrackEventCategory& other) const {
  return unknown_fields_ == other.unknown_fields_
   && name_ == other.name_
   && description_ == other.description_
   && tags_ == other.tags_;
}